

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subbreak3.cpp
# Opt level: O0

void (anonymous_namespace)::shuffle<std::vector<int,std::allocator<int>>>
               (vector<int,_std::allocator<int>_> *t,int start,int end,THint *hint)

{
  int iVar1;
  size_type sVar2;
  const_reference pvVar3;
  reference __a;
  reference __b;
  vector<int,_std::allocator<int>_> *in_RCX;
  int in_EDX;
  int in_ESI;
  vector<int,_std::allocator<int>_> *in_RDI;
  int i1;
  int i0;
  int i;
  int local_1c;
  int local_c;
  
  local_c = in_ESI;
  if (in_ESI == -1) {
    local_c = 0;
  }
  if (in_EDX == -1) {
    sVar2 = std::vector<int,_std::allocator<int>_>::size(in_RDI);
    in_EDX = (int)sVar2;
  }
  while (local_1c = in_EDX + -1, local_c < local_1c) {
    iVar1 = rand();
    iVar1 = iVar1 % ((local_1c - local_c) + 1) + local_c;
    sVar2 = std::vector<int,_std::allocator<int>_>::size(in_RCX);
    in_EDX = local_1c;
    if ((sVar2 == 0) ||
       ((pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](in_RCX,(long)local_1c),
        *pvVar3 == -1 &&
        (pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](in_RCX,(long)iVar1),
        *pvVar3 == -1)))) {
      __a = std::vector<int,_std::allocator<int>_>::operator[](in_RDI,(long)local_1c);
      __b = std::vector<int,_std::allocator<int>_>::operator[](in_RDI,(long)iVar1);
      std::swap<int>(__a,__b);
    }
  }
  return;
}

Assistant:

void shuffle(T & t, int start = -1, int end = -1, const Cipher::THint & hint = {}) {
    if (start == -1) start = 0;
    if (end == -1) end = t.size();

    for (int i = end - 1; i > start; --i) {
        int i0 = i;
        int i1 = rand()%(i - start + 1)+start;
        if (hint.size() > 0 && (hint[i0] != -1 || hint[i1] != -1)) {
            continue;
        }
        std::swap(t[i0], t[i1]);
    }
}